

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

bool __thiscall
trial::protocol::buffer::vector<char,_std::allocator<char>_>::grow
          (vector<char,_std::allocator<char>_> *this,size_type delta)

{
  size_type sVar1;
  ulong __n;
  size_type size;
  size_type delta_local;
  vector<char,_std::allocator<char>_> *this_local;
  
  sVar1 = std::vector<char,_std::allocator<char>_>::size(this->buffer);
  __n = sVar1 + delta;
  sVar1 = std::vector<char,_std::allocator<char>_>::capacity(this->buffer);
  if (sVar1 < __n) {
    sVar1 = std::vector<char,_std::allocator<char>_>::max_size(this->buffer);
    if (sVar1 < __n) {
      return false;
    }
    std::vector<char,_std::allocator<char>_>::reserve(this->buffer,__n);
  }
  return true;
}

Assistant:

virtual bool grow(size_type delta)
    {
        const size_type size = buffer.size() + delta;
        if (size > buffer.capacity())
        {
            if (size > buffer.max_size())
                return false;
            buffer.reserve(size);
        }
        return true;
    }